

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::affine_transform(tensor *dest,tensor *src,float A,float B)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  fatal_error *this;
  long lVar5;
  ostringstream dlib_o_out;
  string local_1b0;
  undefined1 local_190 [376];
  
  if (dest->m_size == src->m_size) {
    iVar2 = (*dest->_vptr_tensor[3])();
    iVar3 = (*src->_vptr_tensor[2])(src);
    lVar1 = src->m_size;
    if (lVar1 != 0) {
      lVar5 = 0;
      do {
        *(float *)(CONCAT44(extraout_var,iVar2) + lVar5 * 4) =
             *(float *)(CONCAT44(extraout_var_00,iVar3) + lVar5 * 4) * A + B;
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar4 = (ostream *)std::ostream::operator<<(local_190,0x19f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "void dlib::cpu::affine_transform(tensor &, const tensor &, const float, const float)",
             0x54);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"dest.size()==src.size()",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
       *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void affine_transform(
            tensor& dest,
            const tensor& src,
            const float A,
            const float B
        )
        {
            DLIB_CASSERT(dest.size()==src.size());
            const auto d = dest.host();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
                d[i] = A*s[i] + B;
        }